

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
uttt::IBoard::GetPossibleMoves
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,IBoard *this)

{
  short sVar1;
  char *pcVar2;
  int i;
  char *pcVar3;
  long lVar4;
  int local_40;
  int local_3c;
  IBoard *local_38;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((long)this->next < 0) {
    local_38 = this;
    for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
      sVar1 = (local_38->micro)._M_elems[lVar4];
      pcVar2 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar3 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start; pcVar3 != pcVar2; pcVar3 = pcVar3 + 1) {
        local_40 = (int)*pcVar3 + (int)lVar4 * 9;
        std::vector<long,_std::allocator<long>_>::emplace_back<int>
                  (__return_storage_ptr__,&local_40);
      }
    }
  }
  else {
    sVar1 = (this->micro)._M_elems[this->next];
    pcVar2 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar3 = g_moves[sVar1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar3 != pcVar2; pcVar3 = pcVar3 + 1) {
      local_3c = this->next * 9 + (int)*pcVar3;
      std::vector<long,_std::allocator<long>_>::emplace_back<int>(__return_storage_ptr__,&local_3c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<game::IMove>
IBoard::GetPossibleMoves() const
{
    std::vector<game::IMove> moves;
    if (next >= 0)
        for (auto m : g_moves[micro[next]])
            moves.emplace_back(next * 9 + m);
    else
        for (int i = 0; i < 9; i++)
            for (auto m : g_moves[micro[i]])
                moves.emplace_back(i * 9 + m);
    return moves;
}